

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_ApproximateSize::_Run(_Test_ApproximateSize *this)

{
  Tester local_590;
  size_t local_3f0;
  size_t post_delete_size;
  Tester local_3d8;
  size_t local_238;
  size_t two_keys_size;
  Slice local_220;
  Tester local_210;
  size_t local_70;
  size_t one_key_size;
  Slice local_58 [2];
  size_t local_38;
  size_t empty_size;
  WriteBatch batch;
  _Test_ApproximateSize *this_local;
  
  batch._24_8_ = this;
  WriteBatch::WriteBatch((WriteBatch *)&empty_size);
  local_38 = WriteBatch::ApproximateSize((WriteBatch *)&empty_size);
  Slice::Slice(local_58,"foo");
  Slice::Slice((Slice *)&one_key_size,"bar");
  WriteBatch::Put((WriteBatch *)&empty_size,local_58,(Slice *)&one_key_size);
  local_70 = WriteBatch::ApproximateSize((WriteBatch *)&empty_size);
  test::Tester::Tester
            (&local_210,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x7c);
  test::Tester::IsLt<unsigned_long,unsigned_long>(&local_210,&local_38,&local_70);
  test::Tester::~Tester(&local_210);
  Slice::Slice(&local_220,"baz");
  Slice::Slice((Slice *)&two_keys_size,"boo");
  WriteBatch::Put((WriteBatch *)&empty_size,&local_220,(Slice *)&two_keys_size);
  local_238 = WriteBatch::ApproximateSize((WriteBatch *)&empty_size);
  test::Tester::Tester
            (&local_3d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x80);
  test::Tester::IsLt<unsigned_long,unsigned_long>(&local_3d8,&local_70,&local_238);
  test::Tester::~Tester(&local_3d8);
  Slice::Slice((Slice *)&post_delete_size,"box");
  WriteBatch::Delete((WriteBatch *)&empty_size,(Slice *)&post_delete_size);
  local_3f0 = WriteBatch::ApproximateSize((WriteBatch *)&empty_size);
  test::Tester::Tester
            (&local_590,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x84);
  test::Tester::IsLt<unsigned_long,unsigned_long>(&local_590,&local_238,&local_3f0);
  test::Tester::~Tester(&local_590);
  WriteBatch::~WriteBatch((WriteBatch *)&empty_size);
  return;
}

Assistant:

TEST(WriteBatchTest, ApproximateSize) {
  WriteBatch batch;
  size_t empty_size = batch.ApproximateSize();

  batch.Put(Slice("foo"), Slice("bar"));
  size_t one_key_size = batch.ApproximateSize();
  ASSERT_LT(empty_size, one_key_size);

  batch.Put(Slice("baz"), Slice("boo"));
  size_t two_keys_size = batch.ApproximateSize();
  ASSERT_LT(one_key_size, two_keys_size);

  batch.Delete(Slice("box"));
  size_t post_delete_size = batch.ApproximateSize();
  ASSERT_LT(two_keys_size, post_delete_size);
}